

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O0

void __thiscall
Script_SetStackData_kOpPushData4_Test::TestBody(Script_SetStackData_kOpPushData4_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  AssertHelper local_158;
  Message local_150;
  int local_144;
  ByteData local_140;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_2;
  Message local_f8;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_f0;
  size_type local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  Message local_b8;
  bool local_aa;
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  size_t size;
  undefined1 local_78 [8];
  Script script;
  allocator<unsigned_char> local_2a;
  value_type local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  Script_SetStackData_kOpPushData4_Test *this_local;
  
  local_29 = '\x01';
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_2a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (local_28,0x10005,&local_29,&local_2a);
  std::allocator<unsigned_char>::~allocator(&local_2a);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_28,0);
  *pvVar2 = 'N';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_28,1);
  *pvVar2 = '\0';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_28,2);
  *pvVar2 = '\0';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_28,3);
  *pvVar2 = '\x01';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_28,4);
  *pvVar2 = '\0';
  cfd::core::ByteData::ByteData
            ((ByteData *)&size,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  cfd::core::Script::Script((Script *)local_78,(ByteData *)&size);
  cfd::core::ByteData::~ByteData((ByteData *)&size);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_a9 = cfd::core::Script::IsEmpty((Script *)local_78);
  local_aa = false;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_a8,"script.IsEmpty()","false",&local_a9,&local_aa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
               ,0xbc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  cfd::core::Script::GetElementList(&local_f0,(Script *)local_78);
  local_d8 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::size
                       (&local_f0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_d0,"script.GetElementList().size()","size",&local_d8,
             (unsigned_long *)&gtest_ar.message_);
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
               ,0xbd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  cfd::core::Script::GetData(&local_140,(Script *)local_78);
  cfd::core::ByteData::GetBytes(&local_128,&local_140);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,0);
  local_144 = 0x4e;
  testing::internal::EqHelper<false>::Compare<unsigned_char,int>
            ((EqHelper<false> *)local_110,"script.GetData().GetBytes()[0]","0x4e",pvVar2,&local_144)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128);
  cfd::core::ByteData::~ByteData(&local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
               ,0xbe,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  cfd::core::Script::~Script((Script *)local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_28);
  return;
}

Assistant:

TEST(Script, SetStackData_kOpPushData4) {
  // script作成
  // Builderではサイズエラーになるので、bytedataを自作
  std::vector<uint8_t> bytes(65541, 1);
  bytes[0] = 0x4e;
  bytes[1] = 0x00;
  bytes[2] = 0x00;
  bytes[3] = 0x01;
  bytes[4] = 0x00;
  Script script(bytes);

  size_t size = 1;
  EXPECT_EQ(script.IsEmpty(), false);
  EXPECT_EQ(script.GetElementList().size(), size);
  EXPECT_EQ(script.GetData().GetBytes()[0], 0x4e);
}